

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGenerator.h
# Opt level: O0

void __thiscall SudokuGenerator::SudokuGenerator(SudokuGenerator *this,uint elements)

{
  uint elements_local;
  SudokuGenerator *this_local;
  
  this->elementCount = elements;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&this->errorInRow);
  SudokuGitter::SudokuGitter(&this->gitter,elements);
  return;
}

Assistant:

explicit SudokuGenerator(unsigned int elements) : elementCount(elements), gitter(SudokuGitter(elements)) {}